

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

TestCase * __thiscall doctest::detail::TestCase::operator=(TestCase *this,TestCase *other)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined3 uVar10;
  int iVar11;
  undefined4 uVar12;
  String *this_00;
  
  String::operator=((String *)this,(String *)other);
  uVar4 = *(undefined4 *)&(other->super_TestCaseData).field_0x1c;
  pcVar1 = (other->super_TestCaseData).m_name;
  pcVar2 = (other->super_TestCaseData).m_test_suite;
  pcVar3 = (other->super_TestCaseData).m_description;
  bVar5 = (other->super_TestCaseData).m_skip;
  bVar6 = (other->super_TestCaseData).m_no_breaks;
  bVar7 = (other->super_TestCaseData).m_no_output;
  bVar8 = (other->super_TestCaseData).m_may_fail;
  bVar9 = (other->super_TestCaseData).m_should_fail;
  uVar10 = *(undefined3 *)&(other->super_TestCaseData).field_0x3d;
  iVar11 = (other->super_TestCaseData).m_expected_failures;
  uVar12 = *(undefined4 *)&(other->super_TestCaseData).field_0x44;
  (this->super_TestCaseData).m_line = (other->super_TestCaseData).m_line;
  *(undefined4 *)&(this->super_TestCaseData).field_0x1c = uVar4;
  (this->super_TestCaseData).m_name = pcVar1;
  (this->super_TestCaseData).m_test_suite = pcVar2;
  (this->super_TestCaseData).m_description = pcVar3;
  (this->super_TestCaseData).m_skip = bVar5;
  (this->super_TestCaseData).m_no_breaks = bVar6;
  (this->super_TestCaseData).m_no_output = bVar7;
  (this->super_TestCaseData).m_may_fail = bVar8;
  (this->super_TestCaseData).m_should_fail = bVar9;
  *(undefined3 *)&(this->super_TestCaseData).field_0x3d = uVar10;
  (this->super_TestCaseData).m_expected_failures = iVar11;
  *(undefined4 *)&(this->super_TestCaseData).field_0x44 = uVar12;
  (this->super_TestCaseData).m_timeout = (other->super_TestCaseData).m_timeout;
  this->m_test = other->m_test;
  this->m_type = other->m_type;
  this->m_template_id = other->m_template_id;
  this_00 = &this->m_full_name;
  String::operator=(this_00,&other->m_full_name);
  if (this->m_template_id != -1) {
    if ((this->m_full_name).field_0.buf[0x17] < '\0') {
      this_00 = (String *)(this->m_full_name).field_0.data.ptr;
    }
    (this->super_TestCaseData).m_name = (char *)this_00;
  }
  return this;
}

Assistant:

TestCase& TestCase::operator=(const TestCase& other) {
        static_cast<TestCaseData&>(*this) = static_cast<const TestCaseData&>(other);

        m_test        = other.m_test;
        m_type        = other.m_type;
        m_template_id = other.m_template_id;
        m_full_name   = other.m_full_name;

        if(m_template_id != -1)
            m_name = m_full_name.c_str();
        return *this;
    }